

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xml_document::_move(xml_document *this,xml_document *rhs)

{
  xml_node_struct *pxVar1;
  xml_document_struct *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  xml_node_struct *local_80;
  xml_allocator *local_68;
  xml_node_struct *local_58;
  xml_node_struct *node;
  xml_memory_page *page_1;
  xml_memory_page *page;
  xml_memory_page *other_page;
  xml_memory_page *doc_page;
  xml_node_struct *other_first_child;
  xml_document_struct *other;
  xml_document_struct *doc;
  xml_document *rhs_local;
  xml_document *this_local;
  
  pxVar1 = (this->super_xml_node)._root;
  this_00 = (xml_document_struct *)(rhs->super_xml_node)._root;
  local_58 = (this_00->super_xml_node_struct).first_child;
  pxVar1[1].header = (uintptr_t)(this_00->super_xml_allocator)._root;
  pxVar1[1].name = (char_t *)(this_00->super_xml_allocator)._busy_size;
  pxVar1[1].value = this_00->buffer;
  pxVar1[1].parent = (xml_node_struct *)this_00->extra_buffers;
  this->_buffer = rhs->_buffer;
  lVar3 = (long)pxVar1 - (pxVar1->header >> 8);
  bVar5 = false;
  if ((lVar3 != 0) && (bVar5 = false, *(long *)(lVar3 + 8) == 0)) {
    bVar5 = *(long *)(lVar3 + 0x10) == 0;
  }
  if (!bVar5) {
    __assert_fail("doc_page && !doc_page->prev && !doc_page->next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x1b9e,"void pugi::xml_document::_move(xml_document &)");
  }
  lVar4 = (long)this_00 - ((this_00->super_xml_node_struct).header >> 8);
  bVar5 = false;
  if (lVar4 != 0) {
    bVar5 = *(long *)(lVar4 + 8) == 0;
  }
  if (!bVar5) {
    __assert_fail("other_page && !other_page->prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x1ba1,"void pugi::xml_document::_move(xml_document &)");
  }
  lVar2 = *(long *)(lVar4 + 0x10);
  if (lVar2 != 0) {
    if (*(long *)(lVar2 + 8) != lVar4) {
      __assert_fail("page->prev == other_page",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x1ba6,"void pugi::xml_document::_move(xml_document &)");
    }
    *(long *)(lVar2 + 8) = lVar3;
    *(long *)(lVar3 + 0x10) = lVar2;
    *(undefined8 *)(lVar4 + 0x10) = 0;
  }
  node = *(xml_node_struct **)(lVar3 + 0x10);
  while( true ) {
    if (node == (xml_node_struct *)0x0) {
      if (pxVar1->first_child != (xml_node_struct *)0x0) {
        __assert_fail("!doc->first_child",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x1bbd,"void pugi::xml_document::_move(xml_document &)");
      }
      pxVar1->first_child = local_58;
      while( true ) {
        if (local_58 == (xml_node_struct *)0x0) {
          impl::anon_unknown_0::xml_document_struct::xml_document_struct
                    (this_00,(xml_memory_page *)
                             ((long)this_00 - ((this_00->super_xml_node_struct).header >> 8)));
          rhs->_buffer = (char_t *)0x0;
          return;
        }
        if ((xml_document_struct *)local_58->parent != this_00) break;
        local_58->parent = pxVar1;
        local_58 = local_58->next_sibling;
      }
      __assert_fail("node->parent == other",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x1bc9,"void pugi::xml_document::_move(xml_document &)");
    }
    local_68 = (xml_allocator *)0x0;
    if (this_00 != (xml_document_struct *)0x0) {
      local_68 = &this_00->super_xml_allocator;
    }
    if ((xml_allocator *)node->header != local_68) break;
    local_80 = (xml_node_struct *)0x0;
    if (pxVar1 != (xml_node_struct *)0x0) {
      local_80 = pxVar1 + 1;
    }
    node->header = (uintptr_t)local_80;
    node = (xml_node_struct *)node->value;
  }
  __assert_fail("page->allocator == other",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0x1bb1,"void pugi::xml_document::_move(xml_document &)");
}

Assistant:

PUGI__FN void xml_document::_move(xml_document& rhs) PUGIXML_NOEXCEPT_IF_NOT_COMPACT
	{
		impl::xml_document_struct* doc = static_cast<impl::xml_document_struct*>(_root);
		impl::xml_document_struct* other = static_cast<impl::xml_document_struct*>(rhs._root);

		// save first child pointer for later; this needs hash access
		xml_node_struct* other_first_child = other->first_child;

	#ifdef PUGIXML_COMPACT
		// reserve space for the hash table up front; this is the only operation that can fail
		// if it does, we have no choice but to throw (if we have exceptions)
		if (other_first_child)
		{
			size_t other_children = 0;
			for (xml_node_struct* node = other_first_child; node; node = node->next_sibling)
				other_children++;

			// in compact mode, each pointer assignment could result in a hash table request
			// during move, we have to relocate document first_child and parents of all children
			// normally there's just one child and its parent has a pointerless encoding but
			// we assume the worst here
			if (!other->_hash->reserve(other_children + 1))
			{
			#ifdef PUGIXML_NO_EXCEPTIONS
				return;
			#else
				throw std::bad_alloc();
			#endif
			}
		}
	#endif

		// move allocation state
		doc->_root = other->_root;
		doc->_busy_size = other->_busy_size;

		// move buffer state
		doc->buffer = other->buffer;
		doc->extra_buffers = other->extra_buffers;
		_buffer = rhs._buffer;

	#ifdef PUGIXML_COMPACT
		// move compact hash; note that the hash table can have pointers to other but they will be "inactive", similarly to nodes removed with remove_child
		doc->hash = other->hash;
		doc->_hash = &doc->hash;

		// make sure we don't access other hash up until the end when we reinitialize other document
		other->_hash = 0;
	#endif

		// move page structure
		impl::xml_memory_page* doc_page = PUGI__GETPAGE(doc);
		assert(doc_page && !doc_page->prev && !doc_page->next);

		impl::xml_memory_page* other_page = PUGI__GETPAGE(other);
		assert(other_page && !other_page->prev);

		// relink pages since root page is embedded into xml_document
		if (impl::xml_memory_page* page = other_page->next)
		{
			assert(page->prev == other_page);

			page->prev = doc_page;

			doc_page->next = page;
			other_page->next = 0;
		}

		// make sure pages point to the correct document state
		for (impl::xml_memory_page* page = doc_page->next; page; page = page->next)
		{
			assert(page->allocator == other);

			page->allocator = doc;

		#ifdef PUGIXML_COMPACT
			// this automatically migrates most children between documents and prevents ->parent assignment from allocating
			if (page->compact_shared_parent == other)
				page->compact_shared_parent = doc;
		#endif
		}

		// move tree structure
		assert(!doc->first_child);

		doc->first_child = other_first_child;

		for (xml_node_struct* node = other_first_child; node; node = node->next_sibling)
		{
		#ifdef PUGIXML_COMPACT
			// most children will have migrated when we reassigned compact_shared_parent
			assert(node->parent == other || node->parent == doc);

			node->parent = doc;
		#else
			assert(node->parent == other);
			node->parent = doc;
		#endif
		}

		// reset other document
		new (other) impl::xml_document_struct(PUGI__GETPAGE(other));
		rhs._buffer = 0;
	}